

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  test_var_type tVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  int sub_script_entry_index;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  bool bVar13;
  string shader_source;
  int local_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *local_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string array_initializers [5];
  
  array_initializers[0]._M_dataplus._M_p = (pointer)&array_initializers[0].field_2;
  local_160 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)array_initializers,
             "int[2][2][2][2](\n    int[2][2][2](\n        int[2][2](\n            int[2]( 1,  2),\n            int[2]( 3,  4)\n        ),\n        int[2][2](\n            int[2]( 5,  6),\n            int[2]( 7,  8)\n        )\n    ),\n    int[2][2][2](\n        int[2][2](\n            int[2](11, 12),\n            int[2](13, 14)\n        ),\n        int[2][2](\n            int[2](15, 16),\n            int[2](17, 18)\n        )\n    )\n)"
             ,"");
  array_initializers[1]._M_dataplus._M_p = (pointer)&array_initializers[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 1),
             "float[2][2][2][2](\n    float[2][2][2](\n        float[2][2](\n            float[2](1.0, 2.0),\n            float[2](3.0, 4.0)),\n        float[2][2](\n            float[2](5.0, 6.0),\n            float[2](7.0, 8.0))),\n    float[2][2][2](\n        float[2][2](\n            float[2](1.1, 2.1),\n            float[2](3.1, 4.1)\n        ),\n        float[2][2](\n            float[2](5.1, 6.1),\n            float[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  array_initializers[2]._M_dataplus._M_p = (pointer)&array_initializers[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 2),
             "mat4[2][2][2][2](\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2]( mat4(1),  mat4(2)),\n            mat4[2]( mat4(3),  mat4(4))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(5),  mat4(6)),\n            mat4[2](mat4(7),  mat4(8))\n        )\n    ),\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2](mat4(9),  mat4(10)),\n            mat4[2](mat4(11),  mat4(12))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(13),  mat4(14)),\n            mat4[2](mat4(15),  mat4(16))\n        )\n    )\n)"
             ,"");
  array_initializers[3]._M_dataplus._M_p = (pointer)&array_initializers[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](\n    double[2][2][2](\n        double[2][2](\n            double[2](1.0, 2.0),\n            double[2](3.0, 4.0)),\n        double[2][2](\n            double[2](5.0, 6.0),\n            double[2](7.0, 8.0))),\n    double[2][2][2](\n        double[2][2](\n            double[2](1.1, 2.1),\n            double[2](3.1, 4.1)\n        ),\n        double[2][2](\n            double[2](5.1, 6.1),\n            double[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  array_initializers[4]._M_dataplus._M_p = (pointer)&array_initializers[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 4),
             "dmat4[2][2][2][2](\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2]( dmat4(1),  dmat4(2)),\n            dmat4[2]( dmat4(3),  dmat4(4))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(5),  dmat4(6)),\n            dmat4[2](dmat4(7),  dmat4(8))\n        )\n    ),\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2](dmat4(9),   dmat4(10)),\n            dmat4[2](dmat4(11),  dmat4(12))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(13),  dmat4(14)),\n            dmat4[2](dmat4(15),  dmat4(16))\n        )\n    )\n)"
             ,"");
  lVar9 = 0;
  while (supported_variable_types_map._16_8_ != 0) {
    tVar1 = test_shader_compilation::var_types_set_gl[lVar9];
    lVar10 = 0x21e5b78;
    lVar5 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar5 + 0x20)) {
        lVar10 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < (int)tVar1) * 8);
    } while (lVar5 != 0);
    if ((lVar10 == 0x21e5b78) || ((int)tVar1 < *(int *)(lVar10 + 0x20))) break;
    base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
    base_variable_string._M_string_length = 0;
    base_variable_string.field_2._M_local_buf[0] = '\0';
    local_188 = 1;
    do {
      iVar11 = 0xe;
      do {
        std::operator+(&local_f8,"uniform ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar10 + 0x48));
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_180 = &local_170;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_170 = *plVar6;
          lStack_168 = plVar2[3];
        }
        else {
          local_170 = *plVar6;
          local_180 = (long *)*plVar2;
        }
        local_178 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_180,*(ulong *)(lVar10 + 0x28));
        local_158 = &local_148;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_148 = *plVar6;
          lStack_140 = plVar2[3];
        }
        else {
          local_148 = *plVar6;
          local_158 = (long *)*plVar2;
        }
        local_150 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_158);
        psVar7 = (size_type *)(plVar2 + 2);
        if ((size_type *)*plVar2 == psVar7) {
          shader_source.field_2._M_allocated_capacity = *psVar7;
          shader_source.field_2._8_8_ = plVar2[3];
          shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
        }
        else {
          shader_source.field_2._M_allocated_capacity = *psVar7;
          shader_source._M_dataplus._M_p = (pointer)*plVar2;
        }
        shader_source._M_string_length = plVar2[1];
        *plVar2 = (long)psVar7;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::operator=((string *)&base_variable_string,(string *)&shader_source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
          operator_delete(shader_source._M_dataplus._M_p,
                          shader_source.field_2._M_allocated_capacity + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        iVar8 = 3;
        do {
          std::__cxx11::string::append((char *)&base_variable_string);
          bVar13 = iVar8 != 0;
          iVar8 = iVar8 + -1;
        } while (bVar13);
        if (local_188 == 0) {
          std::operator+(&shader_source," = ",array_initializers + lVar9);
          std::__cxx11::string::_M_append
                    ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
            operator_delete(shader_source._M_dataplus._M_p,
                            shader_source.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&base_variable_string);
        std::operator+(&shader_source,&base_variable_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shader_start_abi_cxx11_);
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1aa1);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        puVar3 = &set_tesseation_abi_cxx11_;
        switch((ulong)tested_shader_type) {
        case 1:
          std::__cxx11::string::append((char *)&shader_source);
          break;
        case 3:
          puVar3 = &emit_quad_abi_cxx11_;
        case 4:
          std::__cxx11::string::_M_append((char *)&shader_source,*puVar3);
        }
        std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
        if (local_188 == 0 || iVar11 == 7) {
          (*(code *)(&DAT_01aca9ac + *(int *)(&DAT_01aca9ac + (ulong)tested_shader_type * 4)))
                    (&DAT_01aca9ac + *(int *)(&DAT_01aca9ac + (ulong)tested_shader_type * 4),
                     empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                     empty_string_abi_cxx11_,empty_string_abi_cxx11_);
          return;
        }
        (*(local_160->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])(local_160,(ulong)tested_shader_type,&shader_source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
          operator_delete(shader_source._M_dataplus._M_p,
                          shader_source.field_2._M_allocated_capacity + 1);
        }
        bVar13 = iVar11 != 0;
        iVar11 = iVar11 + -1;
      } while (bVar13);
      bVar13 = local_188 != 0;
      local_188 = local_188 + -1;
    } while (bVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_variable_string._M_dataplus._M_p != &base_variable_string.field_2) {
      operator_delete(base_variable_string._M_dataplus._M_p,
                      CONCAT71(base_variable_string.field_2._M_allocated_capacity._1_7_,
                               base_variable_string.field_2._M_local_buf[0]) + 1);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 5) {
      lVar9 = -0xa0;
      paVar12 = &array_initializers[4].field_2;
      do {
        plVar2 = (long *)(((string *)(paVar12 + -1))->_M_dataplus)._M_p;
        if (paVar12 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar2) {
          operator_delete(plVar2,paVar12->_M_allocated_capacity + 1);
        }
        paVar12 = paVar12 + -2;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0);
      return;
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1ab4);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniforms2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string array_initializers[] = { "int[2][2][2][2](\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2]( 1,  2),\n"
											   "            int[2]( 3,  4)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2]( 5,  6),\n"
											   "            int[2]( 7,  8)\n"
											   "        )\n"
											   "    ),\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2](11, 12),\n"
											   "            int[2](13, 14)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2](15, 16),\n"
											   "            int[2](17, 18)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "float[2][2][2][2](\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.0, 2.0),\n"
											   "            float[2](3.0, 4.0)),\n"
											   "        float[2][2](\n"
											   "            float[2](5.0, 6.0),\n"
											   "            float[2](7.0, 8.0))),\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.1, 2.1),\n"
											   "            float[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        float[2][2](\n"
											   "            float[2](5.1, 6.1),\n"
											   "            float[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "mat4[2][2][2][2](\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2]( mat4(1),  mat4(2)),\n"
											   "            mat4[2]( mat4(3),  mat4(4))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(5),  mat4(6)),\n"
											   "            mat4[2](mat4(7),  mat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(9),  mat4(10)),\n"
											   "            mat4[2](mat4(11),  mat4(12))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(13),  mat4(14)),\n"
											   "            mat4[2](mat4(15),  mat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "double[2][2][2][2](\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.0, 2.0),\n"
											   "            double[2](3.0, 4.0)),\n"
											   "        double[2][2](\n"
											   "            double[2](5.0, 6.0),\n"
											   "            double[2](7.0, 8.0))),\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.1, 2.1),\n"
											   "            double[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        double[2][2](\n"
											   "            double[2](5.1, 6.1),\n"
											   "            double[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "dmat4[2][2][2][2](\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2]( dmat4(1),  dmat4(2)),\n"
											   "            dmat4[2]( dmat4(3),  dmat4(4))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(5),  dmat4(6)),\n"
											   "            dmat4[2](dmat4(7),  dmat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(9),   dmat4(10)),\n"
											   "            dmat4[2](dmat4(11),  dmat4(12))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(13),  dmat4(14)),\n"
											   "            dmat4[2](dmat4(15),  dmat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")" };

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (int initialiser_selector = 1; initialiser_selector >= 0; initialiser_selector--)
			{
				// We normally do all 16 possible permutations of [4][4][4][4] items (15..0).
				// However, in this case we will skip the case that will work,
				// so we'll merely process permutations 14..0
				for (int permutation_index = 14; permutation_index >= 0; permutation_index--)
				{
					base_variable_string =
						"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " x";

					// for all 4 possible sub_script entries
					for (int sub_script_entry_index = 3; sub_script_entry_index >= 0; sub_script_entry_index--)
					{
						if (permutation_index & (1 << sub_script_entry_index))
						{
							// In this case, we'll use a valid sub_script
							base_variable_string += "[2]";
						}
						else
						{
							// In this case, we'll use an invalid sub_script
							base_variable_string += "[]";
						}
					}

					if (initialiser_selector == 0)
					{
						// We'll use an initialiser
						base_variable_string += " = " + array_initializers[var_type_index];
					}

					base_variable_string += ";\n\n";

					std::string shader_source = base_variable_string + shader_start;

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test:
					 *
					 * This will succeed in case of allowed unsized
					 * declarations and when at least one of these is
					 * true:
					 *   1. There is an initialiser.
					 *   2. Only the outermost dimension is unsized,
					 *      as in [][2][2][2].
					 */
					EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION &&
											(initialiser_selector == 0 || permutation_index == 7),
										tested_shader_type, shader_source);
				} /* for (int permutation_index = 14; ...) */
			}	 /* for (int initialiser_selector  = 1; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}